

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall wasm_module_t::wasm_module_t(wasm_module_t *this,wasm_module_t *other)

{
  RefPtr<wabt::interp::Object> local_30;
  wasm_module_t *local_18;
  wasm_module_t *other_local;
  wasm_module_t *this_local;
  
  local_18 = other;
  other_local = this;
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr
            (&local_30,(RefPtr<wabt::interp::Object> *)other);
  wasm_ref_t::wasm_ref_t(&this->super_wasm_ref_t,&local_30);
  wabt::interp::RefPtr<wabt::interp::Object>::~RefPtr(&local_30);
  wasm_byte_vec_copy(&this->binary,&local_18->binary);
  return;
}

Assistant:

wasm_module_t(const wasm_module_t& other) : wasm_ref_t(other.I) {
    wasm_byte_vec_copy(&binary, &other.binary);
  }